

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O3

string * amrex::VisMF::DirName(string *__return_storage_ptr__,string *filename)

{
  char *__s;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  
  if (DirName(std::__cxx11::string_const&)::TheNullString_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&DirName(std::__cxx11::string_const&)::TheNullString_abi_cxx11_);
    if (iVar1 != 0) {
      DirName(std::__cxx11::string_const&)::TheNullString_abi_cxx11_._M_dataplus._M_p =
           (pointer)&DirName(std::__cxx11::string_const&)::TheNullString_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&DirName(std::__cxx11::string_const&)::TheNullString_abi_cxx11_,"");
      __cxa_atexit(std::__cxx11::string::~string,
                   &DirName(std::__cxx11::string_const&)::TheNullString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&DirName(std::__cxx11::string_const&)::TheNullString_abi_cxx11_);
    }
  }
  __s = (filename->_M_dataplus)._M_p;
  pcVar2 = strrchr(__s,0x2f);
  if (pcVar2 == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,
               DirName(std::__cxx11::string_const&)::TheNullString_abi_cxx11_._M_dataplus._M_p,
               DirName(std::__cxx11::string_const&)::TheNullString_abi_cxx11_._M_dataplus._M_p +
               DirName(std::__cxx11::string_const&)::TheNullString_abi_cxx11_._M_string_length);
  }
  else {
    lVar4 = (ulong)(uint)((int)pcVar2 - (int)__s) << 0x20;
    pcVar2 = (char *)operator_new__(lVar4 + 0x200000000 >> 0x20);
    sVar3 = lVar4 + 0x100000000 >> 0x20;
    strncpy(pcVar2,__s,sVar3);
    pcVar2[sVar3] = '\0';
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar3 = strlen(pcVar2);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar3);
    operator_delete__(pcVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
VisMF::DirName (const std::string& filename)
{
    BL_ASSERT(filename[filename.length() - 1] != '/');

    static const std::string TheNullString("");

    const char *str = filename.c_str();

    if(const char *slash = strrchr(str, '/')) {
        //
        // Got at least one slash -- return the dirname including last slash.
        //
        int len((slash - str) + 1);

        char *buf = new char[len+1];

        strncpy(buf, str, len);

        buf[len] = 0;   // Stringify

        std::string dirname = buf;

        delete [] buf;

        return dirname;
    } else {
        //
        // No directory name here.
        //
        return TheNullString;
    }
}